

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool __thiscall cmSetPropertyCommand::HandleInstallMode(cmSetPropertyCommand *this)

{
  cmMakefile *mf;
  const_iterator this_00;
  bool bVar1;
  reference pbVar2;
  cmInstalledFile *file_00;
  ostream *poVar3;
  string local_1e0;
  ostringstream local_1b0 [8];
  ostringstream e;
  cmInstalledFile *file;
  _Self local_28;
  const_iterator i;
  cmake *cm;
  cmSetPropertyCommand *this_local;
  
  i._M_node = (_Base_ptr)cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
  local_28._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->Names);
  while( true ) {
    file = (cmInstalledFile *)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->Names);
    bVar1 = std::operator!=(&local_28,(_Self *)&file);
    this_00 = i;
    if (!bVar1) {
      return true;
    }
    mf = (this->super_cmCommand).Makefile;
    pbVar2 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_28);
    file_00 = cmake::GetOrCreateInstalledFile((cmake *)this_00._M_node,mf,pbVar2);
    if (file_00 == (cmInstalledFile *)0x0) break;
    bVar1 = HandleInstall(this,file_00);
    if (!bVar1) {
      return false;
    }
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_28);
  }
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  poVar3 = std::operator<<((ostream *)local_1b0,
                           "given INSTALL name that could not be found or created: ");
  pbVar2 = std::
           _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&local_28);
  std::operator<<(poVar3,(string *)pbVar2);
  std::__cxx11::ostringstream::str();
  cmCommand::SetError(&this->super_cmCommand,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return false;
}

Assistant:

bool cmSetPropertyCommand::HandleInstallMode()
{
  cmake* cm = this->Makefile->GetCMakeInstance();

  for(std::set<std::string>::const_iterator i = this->Names.begin();
      i != this->Names.end(); ++i)
    {
    if(cmInstalledFile* file = cm->GetOrCreateInstalledFile(
      this->Makefile, *i))
      {
      if(!this->HandleInstall(file))
        {
        return false;
        }
      }
    else
      {
      std::ostringstream e;
      e << "given INSTALL name that could not be found or created: " << *i;
      this->SetError(e.str());
      return false;
      }
    }
  return true;
}